

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O3

void zoh_close(SRC_STATE *state)

{
  void *__ptr;
  
  if (state != (SRC_STATE *)0x0) {
    __ptr = state->private_data;
    if (__ptr != (void *)0x0) {
      if (*(void **)((long)__ptr + 0x28) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x28));
      }
      free(__ptr);
    }
    free(state);
    return;
  }
  return;
}

Assistant:

static void
zoh_close (SRC_STATE *state)
{
	if (state)
	{
		ZOH_DATA *zoh = (ZOH_DATA *) state->private_data ;
		if (zoh)
		{
			if (zoh->last_value)
			{
				free (zoh->last_value) ;
				zoh->last_value = NULL ;
			}
			free (zoh) ;
			zoh = NULL ;
		}
		free (state) ;
		state = NULL ;
	}
}